

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ValueType VVar1;
  ArrayIndex AVar2;
  allocator<char> local_229;
  String local_228;
  CZString local_208;
  ArrayIndex local_1f4;
  uint local_1f0;
  ArrayIndex index;
  ArrayIndex i;
  ArrayIndex oldSize;
  String local_1c0;
  ostringstream local_190 [8];
  OStringStream oss;
  ArrayIndex newSize_local;
  Value *this_local;
  
  VVar1 = type(this);
  if ((VVar1 != nullValue) && (VVar1 = type(this), VVar1 != arrayValue)) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"in Json::Value::resize(): requires arrayValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c0);
  }
  VVar1 = type(this);
  if (VVar1 == nullValue) {
    Value((Value *)&i,arrayValue);
    operator=(this,(Value *)&i);
    ~Value((Value *)&i);
  }
  local_1f0 = size(this);
  index = local_1f0;
  if (newSize == 0) {
    clear(this);
  }
  else {
    local_1f4 = newSize;
    if (local_1f0 < newSize) {
      for (; local_1f0 < newSize; local_1f0 = local_1f0 + 1) {
        operator[](this,local_1f0);
      }
    }
    else {
      for (; local_1f4 < index; local_1f4 = local_1f4 + 1) {
        this_00 = (this->value_).map_;
        CZString::CZString(&local_208,local_1f4);
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::erase(this_00,&local_208);
        CZString::~CZString(&local_208);
      }
      AVar2 = size(this);
      if (AVar2 != newSize) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"assert json failed",&local_229);
        throwLogicError(&local_228);
      }
    }
  }
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type() == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    for (ArrayIndex i = oldSize; i < newSize; ++i)
      (*this)[i];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    JSON_ASSERT(size() == newSize);
  }
}